

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_unify(nk_rect *clip,nk_rect *a,float x0,float y0,float x1,float y1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 in_register_00001204 [12];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM3_Db;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar8 [16];
  
  auVar9._4_12_ = in_register_00001204;
  auVar9._0_4_ = x0;
  uVar1 = a->x;
  uVar4 = a->y;
  auVar10._4_4_ = uVar4;
  auVar10._0_4_ = uVar1;
  auVar10._8_8_ = 0;
  auVar8._0_8_ = auVar9._0_8_;
  auVar8._8_4_ = in_register_00001204._0_4_;
  auVar8._12_4_ = in_XMM1_Db;
  auVar7._8_8_ = auVar8._8_8_;
  auVar7._4_4_ = y0;
  auVar7._0_4_ = x0;
  auVar9 = maxps(auVar7,auVar10);
  clip->x = (float)(int)auVar9._0_8_;
  clip->y = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
  uVar2 = a->x;
  uVar5 = a->y;
  uVar3 = a->w;
  uVar6 = a->h;
  auVar11._0_4_ = (float)uVar3 + (float)uVar2;
  auVar11._4_4_ = (float)uVar6 + (float)uVar5;
  auVar11._8_8_ = 0;
  auVar12._4_4_ = y1;
  auVar12._0_4_ = x1;
  auVar12._8_4_ = in_XMM2_Db;
  auVar12._12_4_ = in_XMM3_Db;
  auVar12 = minps(auVar11,auVar12);
  auVar13._0_4_ = auVar12._0_4_ - auVar9._0_4_;
  auVar13._4_4_ = auVar12._4_4_ - auVar9._4_4_;
  auVar13._8_4_ = auVar12._8_4_ - auVar9._8_4_;
  auVar13._12_4_ = auVar12._12_4_ - auVar9._12_4_;
  auVar12 = maxps(auVar13,ZEXT816(0));
  clip->w = (float)(int)auVar12._0_8_;
  clip->h = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  return;
}

Assistant:

NK_LIB void
nk_unify(struct nk_rect *clip, const struct nk_rect *a, float x0, float y0,
float x1, float y1)
{
NK_ASSERT(a);
NK_ASSERT(clip);
clip->x = NK_MAX(a->x, x0);
clip->y = NK_MAX(a->y, y0);
clip->w = NK_MIN(a->x + a->w, x1) - clip->x;
clip->h = NK_MIN(a->y + a->h, y1) - clip->y;
clip->w = NK_MAX(0, clip->w);
clip->h = NK_MAX(0, clip->h);
}